

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_extraction.cc
# Opt level: O1

void __thiscall
sptk::PitchExtraction::PitchExtraction
          (PitchExtraction *this,int frame_shift,double sampling_rate,double lower_f0,
          double upper_f0,double voicing_threshold,Algorithms algorithm)

{
  PitchExtractionByHarvest *this_00;
  
  this->_vptr_PitchExtraction = (_func_int **)&PTR__PitchExtraction_00135a30;
  switch(algorithm) {
  case kRapt:
    this_00 = (PitchExtractionByHarvest *)operator_new(0x38);
    PitchExtractionByRapt::PitchExtractionByRapt
              ((PitchExtractionByRapt *)this_00,frame_shift,sampling_rate,lower_f0,upper_f0,
               voicing_threshold);
    break;
  case kSwipe:
    this_00 = (PitchExtractionByHarvest *)operator_new(0x38);
    PitchExtractionBySwipe::PitchExtractionBySwipe
              ((PitchExtractionBySwipe *)this_00,frame_shift,sampling_rate,lower_f0,upper_f0,
               voicing_threshold);
    break;
  case kReaper:
    this_00 = (PitchExtractionByHarvest *)operator_new(0x38);
    PitchExtractionByReaper::PitchExtractionByReaper
              ((PitchExtractionByReaper *)this_00,frame_shift,sampling_rate,lower_f0,upper_f0,
               voicing_threshold);
    break;
  case kDio:
    this_00 = (PitchExtractionByHarvest *)operator_new(0x38);
    PitchExtractionByDio::PitchExtractionByDio
              ((PitchExtractionByDio *)this_00,frame_shift,sampling_rate,lower_f0,upper_f0,
               voicing_threshold);
    break;
  case kHarvest:
    this_00 = (PitchExtractionByHarvest *)operator_new(0x38);
    PitchExtractionByHarvest::PitchExtractionByHarvest
              (this_00,frame_shift,sampling_rate,lower_f0,upper_f0,voicing_threshold);
    break;
  default:
    this_00 = (PitchExtractionByHarvest *)0x0;
  }
  this->pitch_extraction_ = &this_00->super_PitchExtractionInterface;
  return;
}

Assistant:

PitchExtraction::PitchExtraction(int frame_shift, double sampling_rate,
                                 double lower_f0, double upper_f0,
                                 double voicing_threshold,
                                 PitchExtraction::Algorithms algorithm) {
  switch (algorithm) {
    case kRapt: {
      pitch_extraction_ = new PitchExtractionByRapt(
          frame_shift, sampling_rate, lower_f0, upper_f0, voicing_threshold);
      break;
    }
    case kSwipe: {
      pitch_extraction_ = new PitchExtractionBySwipe(
          frame_shift, sampling_rate, lower_f0, upper_f0, voicing_threshold);
      break;
    }
    case kReaper: {
      pitch_extraction_ = new PitchExtractionByReaper(
          frame_shift, sampling_rate, lower_f0, upper_f0, voicing_threshold);
      break;
    }
    case kDio: {
      pitch_extraction_ = new PitchExtractionByDio(
          frame_shift, sampling_rate, lower_f0, upper_f0, voicing_threshold);
      break;
    }
    case kHarvest: {
      pitch_extraction_ = new PitchExtractionByHarvest(
          frame_shift, sampling_rate, lower_f0, upper_f0, voicing_threshold);
      break;
    }
    default: {
      pitch_extraction_ = NULL;
      break;
    }
  }
}